

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

bool __thiscall
cbtCollisionWorldImporter::convertAllObjects
          (cbtCollisionWorldImporter *this,cbtBulletSerializedArrays *arrays)

{
  char *pcVar1;
  long lVar2;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 aVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cbtCollisionShape **ppcVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  undefined1 auVar6 [16];
  cbtCollisionShape *shape;
  char *newname;
  cbtOptimizedBvh *bvh;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_98;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_90;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*> *local_88;
  cbtHashMap<cbtHashPtr,_cbtCollisionObject_*> *local_80;
  cbtHashMap<cbtHashString,_cbtCollisionShape_*> *local_78;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_70 [8];
  
  local_88 = &this->m_shapeMap;
  cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::clear(local_88);
  local_80 = &this->m_bodyMap;
  cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::clear(local_80);
  for (lVar5 = 0; lVar5 < *(int *)(arrays + 4); lVar5 = lVar5 + 1) {
    local_70[0]._0_4_ = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
    local_70[0].m_hashValues[1] = extraout_var;
    (**(code **)(*local_70[0].m_pointer + 0x30))
              (local_70[0].m_pointer,*(undefined8 *)(*(long *)(arrays + 0x10) + lVar5 * 8));
    local_98 = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0x10) + lVar5 * 8);
    cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::insert
              (&this->m_bvhMap,(cbtHashPtr *)&local_98,(cbtOptimizedBvh **)&local_70[0].m_pointer);
  }
  for (lVar5 = 0; lVar5 < *(int *)(arrays + 0x24); lVar5 = lVar5 + 1) {
    local_70[0]._0_4_ = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
    local_70[0].m_hashValues[1] = extraout_var_00;
    (**(code **)(*local_70[0].m_pointer + 0x28))
              (local_70[0].m_pointer,*(undefined8 *)(*(long *)(arrays + 0x30) + lVar5 * 8));
    local_98 = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0x30) + lVar5 * 8);
    cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::insert
              (&this->m_bvhMap,(cbtHashPtr *)&local_98,(cbtOptimizedBvh **)&local_70[0].m_pointer);
  }
  local_78 = &this->m_nameShapeMap;
  for (lVar5 = 0; lVar5 < *(int *)(arrays + 0x44); lVar5 = lVar5 + 1) {
    aVar3 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
            ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0x50) + lVar5 * 8))->
            m_pointer;
    local_98.m_pointer = convertCollisionShape(this,(cbtCollisionShapeData *)aVar3.m_pointer);
    if ((cbtCollisionShape *)local_98.m_pointer != (cbtCollisionShape *)0x0) {
      local_70[0] = aVar3;
      cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::insert
                (local_88,(cbtHashPtr *)local_70,(cbtCollisionShape **)&local_98.m_pointer);
      if (((cbtCollisionShape *)local_98.m_pointer != (cbtCollisionShape *)0x0) &&
         (*aVar3.m_pointer != (char *)0x0)) {
        local_90.m_pointer = duplicateName(this,*aVar3.m_pointer);
        local_70[0].m_pointer = local_98.m_pointer;
        cbtHashMap<cbtHashPtr,_const_char_*>::insert
                  (&this->m_objectNameMap,(cbtHashPtr *)local_70,(char **)&local_90.m_pointer);
        cbtHashString::cbtHashString((cbtHashString *)local_70,(char *)local_90.m_pointer);
        cbtHashMap<cbtHashString,_cbtCollisionShape_*>::insert
                  (local_78,(cbtHashString *)local_70,(cbtCollisionShape **)&local_98.m_pointer);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
  }
  for (lVar5 = 0; lVar5 < *(int *)(arrays + 0xe4); lVar5 = lVar5 + 1) {
    aVar3 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
            ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0xf0) + lVar5 * 8))->
            m_pointer;
    local_70[0] = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)((long)aVar3.m_pointer + 8);
    ppcVar4 = cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::find(local_88,(cbtHashPtr *)local_70);
    if ((ppcVar4 == (cbtCollisionShape **)0x0) || (*ppcVar4 == (cbtCollisionShape *)0x0)) {
      puts("error: no shape found");
    }
    else {
      pcVar1 = (char *)((long)aVar3.m_pointer + 0x98);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      cbtTransform::deSerializeDouble
                ((cbtTransform *)local_70,(cbtTransformDoubleData *)((long)aVar3.m_pointer + 0x20));
      local_98._0_4_ =
           (*this->_vptr_cbtCollisionWorldImporter[3])
                     (this,local_70,*ppcVar4,*(undefined8 *)((long)aVar3.m_pointer + 0x18));
      local_98.m_hashValues[1] = extraout_var_01;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)aVar3.m_pointer + 400);
      auVar6 = vmovhps_avx(auVar6,*(undefined8 *)((long)aVar3.m_pointer + 0x1b0));
      *(int *)&((cbtCollisionShape *)((long)local_98.m_pointer + 0x160))->_vptr_cbtCollisionShape =
           *(int *)&((cbtCollisionShape *)((long)local_98.m_pointer + 0x160))->
                    _vptr_cbtCollisionShape + 2;
      auVar6 = vcvtpd2ps_avx(auVar6);
      lVar2 = vmovlps_avx(auVar6);
      *(long *)((long)local_98.m_pointer + 0xf8) = lVar2;
      local_90 = aVar3;
      cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::insert
                (local_80,(cbtHashPtr *)&local_90,(cbtCollisionObject **)&local_98.m_pointer);
    }
  }
  for (lVar5 = 0; lVar5 < *(int *)(arrays + 0x104); lVar5 = lVar5 + 1) {
    aVar3 = (anon_union_8_2_511b660c_for_cbtHashPtr_0)
            ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)(*(long *)(arrays + 0x110) + lVar5 * 8))->
            m_pointer;
    local_70[0] = *(anon_union_8_2_511b660c_for_cbtHashPtr_0 *)((long)aVar3.m_pointer + 8);
    ppcVar4 = cbtHashMap<cbtHashPtr,_cbtCollisionShape_*>::find(local_88,(cbtHashPtr *)local_70);
    if ((ppcVar4 == (cbtCollisionShape **)0x0) || (*ppcVar4 == (cbtCollisionShape *)0x0)) {
      puts("error: no shape found");
    }
    else {
      pcVar1 = (char *)((long)aVar3.m_pointer + 0x5c);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      cbtTransform::deSerializeFloat
                ((cbtTransform *)local_70,(cbtTransformFloatData *)((long)aVar3.m_pointer + 0x20));
      local_98._0_4_ =
           (*this->_vptr_cbtCollisionWorldImporter[3])
                     (this,local_70,*ppcVar4,*(undefined8 *)((long)aVar3.m_pointer + 0x18));
      local_98.m_hashValues[1] = extraout_var_02;
      local_90 = aVar3;
      cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::insert
                (local_80,(cbtHashPtr *)&local_90,(cbtCollisionObject **)&local_98.m_pointer);
    }
  }
  return true;
}

Assistant:

bool cbtCollisionWorldImporter::convertAllObjects(cbtBulletSerializedArrays* arrays)
{
	m_shapeMap.clear();
	m_bodyMap.clear();

	int i;

	for (i = 0; i < arrays->m_bvhsDouble.size(); i++)
	{
		cbtOptimizedBvh* bvh = createOptimizedBvh();
		cbtQuantizedBvhDoubleData* bvhData = arrays->m_bvhsDouble[i];
		bvh->deSerializeDouble(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsDouble[i], bvh);
	}
	for (i = 0; i < arrays->m_bvhsFloat.size(); i++)
	{
		cbtOptimizedBvh* bvh = createOptimizedBvh();
		cbtQuantizedBvhFloatData* bvhData = arrays->m_bvhsFloat[i];
		bvh->deSerializeFloat(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsFloat[i], bvh);
	}

	for (i = 0; i < arrays->m_colShapeData.size(); i++)
	{
		cbtCollisionShapeData* shapeData = arrays->m_colShapeData[i];
		cbtCollisionShape* shape = convertCollisionShape(shapeData);
		if (shape)
		{
			//		printf("shapeMap.insert(%x,%x)\n",shapeData,shape);
			m_shapeMap.insert(shapeData, shape);
		}

		if (shape && shapeData->m_name)
		{
			char* newname = duplicateName(shapeData->m_name);
			m_objectNameMap.insert(shape, newname);
			m_nameShapeMap.insert(newname, shape);
		}
	}

	for (i = 0; i < arrays->m_collisionObjectDataDouble.size(); i++)
	{
		cbtCollisionObjectDoubleData* colObjData = arrays->m_collisionObjectDataDouble[i];
		cbtCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
		if (shapePtr && *shapePtr)
		{
			cbtTransform startTransform;
			colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
			startTransform.deSerializeDouble(colObjData->m_worldTransform);

			cbtCollisionShape* shape = (cbtCollisionShape*)*shapePtr;
			cbtCollisionObject* body = createCollisionObject(startTransform, shape, colObjData->m_name);
			body->setFriction(cbtScalar(colObjData->m_friction));
			body->setRestitution(cbtScalar(colObjData->m_restitution));

#ifdef USE_INTERNAL_EDGE_UTILITY
			if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				cbtBvhTriangleMeshShape* trimesh = (cbtBvhTriangleMeshShape*)shape;
				if (trimesh->getTriangleInfoMap())
				{
					body->setCollisionFlags(body->getCollisionFlags() | cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
				}
			}
#endif  //USE_INTERNAL_EDGE_UTILITY
			m_bodyMap.insert(colObjData, body);
		}
		else
		{
			printf("error: no shape found\n");
		}
	}
	for (i = 0; i < arrays->m_collisionObjectDataFloat.size(); i++)
	{
		cbtCollisionObjectFloatData* colObjData = arrays->m_collisionObjectDataFloat[i];
		cbtCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
		if (shapePtr && *shapePtr)
		{
			cbtTransform startTransform;
			colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
			startTransform.deSerializeFloat(colObjData->m_worldTransform);

			cbtCollisionShape* shape = (cbtCollisionShape*)*shapePtr;
			cbtCollisionObject* body = createCollisionObject(startTransform, shape, colObjData->m_name);

#ifdef USE_INTERNAL_EDGE_UTILITY
			if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				cbtBvhTriangleMeshShape* trimesh = (cbtBvhTriangleMeshShape*)shape;
				if (trimesh->getTriangleInfoMap())
				{
					body->setCollisionFlags(body->getCollisionFlags() | cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
				}
			}
#endif  //USE_INTERNAL_EDGE_UTILITY
			m_bodyMap.insert(colObjData, body);
		}
		else
		{
			printf("error: no shape found\n");
		}
	}

	return true;
}